

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void __thiscall cppcms::filters::datetime::datetime(datetime *this)

{
  long in_RDI;
  
  streamable::streamable((streamable *)0x40c4e8);
  std::__cxx11::string::string((string *)(in_RDI + 0x20));
  booster::copy_ptr<cppcms::filters::datetime::_data>::copy_ptr
            ((copy_ptr<cppcms::filters::datetime::_data> *)(in_RDI + 0x40));
  return;
}

Assistant:

datetime::datetime() {}